

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O3

EVdfg_stone EVdfg_create_stone(EVdfg dfg,char *action_spec)

{
  CManager cm;
  EVdfg_stone p_Var1;
  
  cm = dfg->master->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O3/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x469);
  p_Var1 = INT_EVdfg_create_stone(dfg,action_spec);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O3/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x46b);
  return p_Var1;
}

Assistant:

extern EVdfg_stone
EVdfg_create_stone ( EVdfg dfg, char *action_spec )
{
	EVdfg_stone ret;
	CManager cm = dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_create_stone(dfg, action_spec);
	CManager_unlock(cm);
	return ret;
}